

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::FormatStrSS<std::__cxx11::stringstream,unsigned_long>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               MemorySizeFormatter<unsigned_long> *Arg)

{
  unsigned_long uVar1;
  _Setprecision _Var2;
  ostream *poVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong local_38;
  unsigned_long ref_size;
  MemorySizeFormatter<unsigned_long> *Arg_local;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  if (Arg->ref_size == 0) {
    local_38 = Arg->size;
  }
  else {
    local_38 = Arg->ref_size;
  }
  if (local_38 < 0x40000000) {
    if (local_38 < 0x100000) {
      if (local_38 < 0x400) {
        poVar3 = (ostream *)std::ostream::operator<<(ss + 0x10,Arg->size);
        pcVar4 = " Bytes";
        if ((Arg->size & 1) == 1) {
          pcVar4 = " Byte";
        }
        std::operator<<(poVar3,pcVar4);
      }
      else {
        poVar3 = (ostream *)std::ostream::operator<<(ss + 0x10,std::fixed);
        _Var2 = std::setprecision(Arg->precision);
        poVar3 = std::operator<<(poVar3,_Var2);
        uVar1 = Arg->size;
        auVar7._8_4_ = (int)(uVar1 >> 0x20);
        auVar7._0_8_ = uVar1;
        auVar7._12_4_ = 0x45300000;
        poVar3 = (ostream *)
                 std::ostream::operator<<
                           (poVar3,((auVar7._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                                   1024.0);
        std::operator<<(poVar3," KB");
      }
    }
    else {
      poVar3 = (ostream *)std::ostream::operator<<(ss + 0x10,std::fixed);
      _Var2 = std::setprecision(Arg->precision);
      poVar3 = std::operator<<(poVar3,_Var2);
      uVar1 = Arg->size;
      auVar6._8_4_ = (int)(uVar1 >> 0x20);
      auVar6._0_8_ = uVar1;
      auVar6._12_4_ = 0x45300000;
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,((auVar6._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                                 1048576.0);
      std::operator<<(poVar3," MB");
    }
  }
  else {
    poVar3 = (ostream *)std::ostream::operator<<(ss + 0x10,std::fixed);
    _Var2 = std::setprecision(Arg->precision);
    poVar3 = std::operator<<(poVar3,_Var2);
    uVar1 = Arg->size;
    auVar5._8_4_ = (int)(uVar1 >> 0x20);
    auVar5._0_8_ = uVar1;
    auVar5._12_4_ = 0x45300000;
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,((auVar5._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                               1073741824.0);
    std::operator<<(poVar3," GB");
  }
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const MemorySizeFormatter<Type>& Arg)
{
    auto ref_size = Arg.ref_size != 0 ? Arg.ref_size : Arg.size;
    if (ref_size >= (1 << 30))
    {
        ss << std::fixed << std::setprecision(Arg.precision) << static_cast<double>(Arg.size) / double{1 << 30} << " GB";
    }
    else if (ref_size >= (1 << 20))
    {
        ss << std::fixed << std::setprecision(Arg.precision) << static_cast<double>(Arg.size) / double{1 << 20} << " MB";
    }
    else if (ref_size >= (1 << 10))
    {
        ss << std::fixed << std::setprecision(Arg.precision) << static_cast<double>(Arg.size) / double{1 << 10} << " KB";
    }
    else
    {
        ss << Arg.size << (((Arg.size & 0x01) == 0x01) ? " Byte" : " Bytes");
    }
}